

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::NetAliasSyntax::setChild(NetAliasSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_0025bc00 + *(int *)(&DAT_0025bc00 + index * 4)))
            (&child,index,in_RDX,&DAT_0025bc00 + *(int *)(&DAT_0025bc00 + index * 4));
  return;
}

Assistant:

void NetAliasSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: nets = child.node()->as<SeparatedSyntaxList<ExpressionSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}